

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

HANDLE CreateFileMappingA(HANDLE hFile,LPSECURITY_ATTRIBUTES lpFileMappingAttributes,DWORD flProtect
                         ,DWORD dwMaximumSizeHigh,DWORD dwMaximumSizeLow,LPCSTR lpName)

{
  CPalThread *pThread_00;
  DWORD local_44;
  PAL_ERROR palError;
  CPalThread *pThread;
  HANDLE hFileMapping;
  LPCSTR lpName_local;
  DWORD local_20;
  DWORD dwMaximumSizeLow_local;
  DWORD dwMaximumSizeHigh_local;
  DWORD flProtect_local;
  LPSECURITY_ATTRIBUTES lpFileMappingAttributes_local;
  HANDLE hFile_local;
  
  pThread = (CPalThread *)0x0;
  hFileMapping = lpName;
  lpName_local._4_4_ = dwMaximumSizeLow;
  local_20 = dwMaximumSizeHigh;
  dwMaximumSizeLow_local = flProtect;
  _dwMaximumSizeHigh_local = lpFileMappingAttributes;
  lpFileMappingAttributes_local = (LPSECURITY_ATTRIBUTES)hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  if (hFileMapping == (HANDLE)0x0) {
    local_44 = CorUnix::InternalCreateFileMapping
                         (pThread_00,lpFileMappingAttributes_local,_dwMaximumSizeHigh_local,
                          dwMaximumSizeLow_local,local_20,lpName_local._4_4_,(LPCWSTR)0x0,&pThread);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateFileMappingA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x12e);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_44 = 0x32;
  }
  CorUnix::CPalThread::SetLastError(local_44);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pThread;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateFileMappingA(
                   IN HANDLE hFile,
                   IN LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
                   IN DWORD flProtect,
                   IN DWORD dwMaximumSizeHigh,
                   IN DWORD dwMaximumSizeLow,
                   IN LPCSTR lpName)
{
    HANDLE hFileMapping = NULL;
    CPalThread *pThread = NULL;
    PAL_ERROR palError = NO_ERROR;

    PERF_ENTRY(CreateFileMappingA);
    ENTRY("CreateFileMappingA(hFile=%p, lpAttributes=%p, flProtect=%#x, "
          "dwMaxSizeH=%d, dwMaxSizeL=%d, lpName=%p (%s))\n",
          hFile, lpFileMappingAttributes, flProtect, 
          dwMaximumSizeHigh, dwMaximumSizeLow,
          lpName?lpName:"NULL",
          lpName?lpName:"NULL");

    pThread = InternalGetCurrentThread();

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateFileMapping(
            pThread,
            hFile,
            lpFileMappingAttributes,
            flProtect,
            dwMaximumSizeHigh,
            dwMaximumSizeLow,
            NULL,
            &hFileMapping
            );
    }


    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pThread->SetLastError(palError);

    LOGEXIT( "CreateFileMappingA returns HANDLE %p. \n", hFileMapping );
    PERF_EXIT(CreateFileMappingA);
    return hFileMapping;
}